

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

bool __thiscall
glcts::TestCaseBase::comparePixel
          (TestCaseBase *this,uchar *buffer,uint x,uint y,uint width,uint height,uint pixel_size,
          uchar expected_red,uchar expected_green,uchar expected_blue,uchar expected_alpha)

{
  uint uVar1;
  bool bVar2;
  bool result;
  uint texel_offset;
  uint image_size;
  uint line_size;
  uint height_local;
  uint width_local;
  uint y_local;
  uint x_local;
  uchar *buffer_local;
  TestCaseBase *this_local;
  
  uVar1 = y * width * pixel_size + x * pixel_size;
  bVar2 = true;
  if (buffer == (uchar *)0x0) {
    this_local._7_1_ = false;
  }
  else if (height * width * pixel_size < uVar1) {
    this_local._7_1_ = false;
  }
  else {
    switch(pixel_size) {
    case 4:
      bVar2 = expected_alpha == buffer[uVar1 + 3];
    case 3:
      bVar2 = (bool)(bVar2 & expected_blue == buffer[uVar1 + 2]);
    case 2:
      bVar2 = (bool)(bVar2 & expected_green == buffer[uVar1 + 1]);
    case 1:
      this_local._7_1_ = (bool)(bVar2 & expected_red == buffer[uVar1]);
      break;
    default:
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TestCaseBase::comparePixel(const unsigned char* buffer, unsigned int x, unsigned int y, unsigned int width,
								unsigned int height, unsigned int pixel_size, unsigned char expected_red,
								unsigned char expected_green, unsigned char expected_blue,
								unsigned char expected_alpha) const
{
	const unsigned int line_size	= width * pixel_size;
	const unsigned int image_size   = height * line_size;
	const unsigned int texel_offset = y * line_size + x * pixel_size;

	bool result = true;

	/* Sanity checks */
	if (0 == buffer)
	{
		return false;
	}

	if (image_size < texel_offset)
	{
		return false;
	}

	switch (pixel_size)
	{
	/* Fall through by design */
	case 4:
	{
		result &= (expected_alpha == buffer[texel_offset + 3]);
	}

	case 3:
	{
		result &= (expected_blue == buffer[texel_offset + 2]);
	}

	case 2:
	{
		result &= (expected_green == buffer[texel_offset + 1]);
	}

	case 1:
	{
		result &= (expected_red == buffer[texel_offset + 0]);

		break;
	}

	default:
	{
		return false;
	}
	} /* switch (pixel_size) */

	return result;
}